

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

bool __thiscall
QLineEditPrivate::sendMouseEventToInputContext(QLineEditPrivate *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Action AVar4;
  uint uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  double dVar7;
  QRect QVar8;
  QArrayData *local_40;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QWidgetLineControl::composeMode((QWidgetLineControl *)this->control);
  if (bVar2) {
    dVar7 = (double)QEventPoint::position();
    dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar7;
    bVar2 = 2147483647.0 < dVar7;
    if (dVar7 <= -2147483648.0) {
      dVar7 = -2147483648.0;
    }
    QVar8 = adjustedContentsRect(this);
    bVar6 = false;
    iVar3 = QWidgetLineControl::xToPos
                      ((QWidgetLineControl *)this->control,
                       (this->hscroll - QVar8.x1.m_i) +
                       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                    ~-(ulong)bVar2 & (ulong)dVar7) + -2,CursorBetweenCharacters);
    uVar5 = iVar3 - this->control->m_cursor;
    if ((int)uVar5 < 0) goto LAB_004205f0;
    QTextLayout::preeditAreaText();
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,2,0x10);
      }
    }
    if (uVar5 <= local_30) {
      bVar6 = true;
      if (*(short *)(e + 8) == 3) {
        AVar4 = QGuiApplication::inputMethod();
        QInputMethod::invokeAction(AVar4,0);
      }
      goto LAB_004205f0;
    }
  }
  bVar6 = false;
LAB_004205f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QLineEditPrivate::sendMouseEventToInputContext( QMouseEvent *e )
{
#if !defined QT_NO_IM
    if ( control->composeMode() ) {
        int tmp_cursor = xToPos(e->position().toPoint().x());
        int mousePos = tmp_cursor - control->cursor();
        if ( mousePos < 0 || mousePos > control->preeditAreaText().size() )
            mousePos = -1;

        if (mousePos >= 0) {
            if (e->type() == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, mousePos);

            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif

    return false;
}